

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::PrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,CppType type)

{
  LogMessage *other;
  char *pcVar1;
  allocator local_49;
  LogMessage local_48;
  
  switch((int)options) {
  case 1:
    std::__cxx11::string::string((string *)&local_48,"int32",&local_49);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                   "_t");
    goto LAB_00287919;
  case 2:
    std::__cxx11::string::string((string *)&local_48,"int64",&local_49);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                   "_t");
    goto LAB_00287919;
  case 3:
    std::__cxx11::string::string((string *)&local_48,"uint32",&local_49);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                   "_t");
    goto LAB_00287919;
  case 4:
    std::__cxx11::string::string((string *)&local_48,"uint64",&local_49);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                   "_t");
LAB_00287919:
    std::__cxx11::string::~string((string *)&local_48);
    return __return_storage_ptr__;
  case 5:
    pcVar1 = "double";
    break;
  case 6:
    pcVar1 = "float";
    break;
  case 7:
    pcVar1 = "bool";
    break;
  case 8:
    pcVar1 = "int";
    break;
  case 9:
    pcVar1 = "std::string";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x24f);
    other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  case 10:
    pcVar1 = "";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveTypeName(const Options& options,
                              FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32:
      return IntTypeName(options, "int32");
    case FieldDescriptor::CPPTYPE_INT64:
      return IntTypeName(options, "int64");
    case FieldDescriptor::CPPTYPE_UINT32:
      return IntTypeName(options, "uint32");
    case FieldDescriptor::CPPTYPE_UINT64:
      return IntTypeName(options, "uint64");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "double";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return "int";
    case FieldDescriptor::CPPTYPE_STRING:
      return "std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "";

      // No default because we want the compiler to complain if any new
      // CppTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}